

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigDialog.cpp
# Opt level: O2

void __thiscall
ConfigDialog::ConfigDialog
          (ConfigDialog *this,Config *config,AudioEnumerator *audio,MidiEnumerator *midi,
          QWidget *parent)

{
  QTabWidget *this_00;
  GeneralConfigTab *this_01;
  GeneralConfig *config_00;
  AppearanceConfigTab *this_02;
  FontTable *fonts;
  Palette *pal;
  KeyboardConfigTab *this_03;
  PianoInput *input;
  ShortcutTable *shortcuts;
  SoundConfigTab *this_04;
  MidiConfig *midiConfig;
  SoundConfig *soundConfig;
  QDialogButtonBox *pQVar1;
  QVBoxLayout *this_05;
  offset_in_QAbstractButton_to_subr signal;
  ConnectionType type;
  QArrayDataPointer<char16_t> local_88;
  MidiEnumerator *local_70;
  Object local_68 [8];
  Object local_60 [8];
  Object local_58 [8];
  Connection local_50 [8];
  Connection local_48 [8];
  Connection local_40 [8];
  Connection local_38 [8];
  
  local_70 = midi;
  QDialog::QDialog(&this->super_QDialog,parent,0x8003000);
  *(undefined ***)this = &PTR_metaObject_001f1150;
  *(undefined ***)&this->field_0x10 = &PTR__ConfigDialog_001f1328;
  this->mConfig = config;
  (this->mDirty).i = 0;
  this_00 = (QTabWidget *)operator_new(0x28);
  QTabWidget::QTabWidget(this_00,(QWidget *)0x0);
  this_01 = (GeneralConfigTab *)operator_new(0x50);
  config_00 = Config::general(config);
  GeneralConfigTab::GeneralConfigTab(this_01,config_00,(QWidget *)0x0);
  this->mGeneral = this_01;
  tr((QString *)&local_88,"General",(char *)0x0,-1);
  QTabWidget::addTab((QWidget *)this_00,(QString *)this_01);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  this_02 = (AppearanceConfigTab *)operator_new(0x88);
  fonts = Config::fonts(config);
  pal = Config::palette(config);
  AppearanceConfigTab::AppearanceConfigTab(this_02,fonts,pal,(QWidget *)0x0);
  this->mAppearance = this_02;
  tr((QString *)&local_88,"Appearance",(char *)0x0,-1);
  QTabWidget::addTab((QWidget *)this_00,(QString *)this_02);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  this_03 = (KeyboardConfigTab *)operator_new(0x80);
  input = Config::pianoInput(config);
  shortcuts = Config::shortcuts(config);
  KeyboardConfigTab::KeyboardConfigTab(this_03,input,shortcuts,(QWidget *)0x0);
  this->mKeyboard = this_03;
  tr((QString *)&local_88,"Keyboard",(char *)0x0,-1);
  QTabWidget::addTab((QWidget *)this_00,(QString *)this_03);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  this_04 = (SoundConfigTab *)operator_new(0x68);
  midiConfig = Config::midi(config);
  soundConfig = Config::sound(config);
  SoundConfigTab::SoundConfigTab(this_04,midiConfig,soundConfig,audio,local_70,(QWidget *)0x0);
  this->mSound = this_04;
  tr((QString *)&local_88,"Sound / MIDI",(char *)0x0,-1);
  QTabWidget::addTab((QWidget *)this_00,(QString *)this_04);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  pQVar1 = (QDialogButtonBox *)operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox(pQVar1,0x2400400,1,0);
  this->mButtons = pQVar1;
  this_05 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_05);
  QBoxLayout::addWidget(this_05,this_00,1,0);
  QBoxLayout::addWidget(this_05,this->mButtons,0,0);
  QLayout::setSizeConstraint((SizeConstraint)this_05);
  QWidget::setLayout((QLayout *)this);
  tr((QString *)&local_88,"Configuration",(char *)0x0,-1);
  QWidget::setWindowTitle((QString *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QDialog::setModal(SUB81(this,0));
  signal = QDialogButtonBox::button((StandardButton)this->mButtons);
  QWidget::setEnabled(SUB81(signal,0));
  local_88.d = (Data *)setDirty;
  local_88.ptr = (char16_t *)0x0;
  type = (ConnectionType)this;
  QObject::connect<void(ConfigTab::*)(Config::Category),void(ConfigDialog::*)(Config::Category)>
            ((Object *)local_38,(offset_in_ConfigTab_to_subr)this->mGeneral,
             (Object *)ConfigTab::dirty,0,type);
  QMetaObject::Connection::~Connection(local_38);
  local_88.d = (Data *)setDirty;
  local_88.ptr = (char16_t *)0x0;
  QObject::connect<void(ConfigTab::*)(Config::Category),void(ConfigDialog::*)(Config::Category)>
            ((Object *)local_40,(offset_in_ConfigTab_to_subr)this->mAppearance,
             (Object *)ConfigTab::dirty,0,type);
  QMetaObject::Connection::~Connection(local_40);
  local_88.d = (Data *)setDirty;
  local_88.ptr = (char16_t *)0x0;
  QObject::connect<void(ConfigTab::*)(Config::Category),void(ConfigDialog::*)(Config::Category)>
            ((Object *)local_48,(offset_in_ConfigTab_to_subr)this->mKeyboard,
             (Object *)ConfigTab::dirty,0,type);
  QMetaObject::Connection::~Connection(local_48);
  local_88.d = (Data *)setDirty;
  local_88.ptr = (char16_t *)0x0;
  QObject::connect<void(ConfigTab::*)(Config::Category),void(ConfigDialog::*)(Config::Category)>
            ((Object *)local_50,(offset_in_ConfigTab_to_subr)this->mSound,(Object *)ConfigTab::dirty
             ,0,type);
  QMetaObject::Connection::~Connection(local_50);
  local_88.d = (Data *)apply;
  local_88.ptr = (char16_t *)0x0;
  QObject::connect<void(QAbstractButton::*)(bool),bool(ConfigDialog::*)()>
            (local_58,signal,(Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  local_88.d = (Data *)0x1b9;
  local_88.ptr = (char16_t *)0x0;
  QObject::connect<void(QDialogButtonBox::*)(),void(ConfigDialog::*)()>
            (local_60,(offset_in_QDialogButtonBox_to_subr)this->mButtons,
             (Object *)QDialogButtonBox::accepted,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  local_88.d = (Data *)0x1c1;
  local_88.ptr = (char16_t *)0x0;
  QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
            (local_68,(offset_in_QDialogButtonBox_to_subr)this->mButtons,
             (Object *)QDialogButtonBox::rejected,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  return;
}

Assistant:

ConfigDialog::ConfigDialog(
    Config &config,
    AudioEnumerator &audio,
    MidiEnumerator &midi,
    QWidget *parent
) :
    QDialog(parent, Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint),
    mConfig(config),
    mDirty(Config::CategoryNone)
{


    auto tabs = new QTabWidget;

    mGeneral = new GeneralConfigTab(config.general());
    tabs->addTab(mGeneral, tr("General"));

    mAppearance = new AppearanceConfigTab(config.fonts(), config.palette());
    tabs->addTab(mAppearance, tr("Appearance"));

    mKeyboard = new KeyboardConfigTab(config.pianoInput(), config.shortcuts());
    tabs->addTab(mKeyboard, tr("Keyboard"));

    mSound = new SoundConfigTab(config.midi(), config.sound(), audio, midi);
    tabs->addTab(mSound, tr("Sound / MIDI"));

    mButtons = new QDialogButtonBox(QDialogButtonBox::Ok | QDialogButtonBox::Cancel | QDialogButtonBox::Apply, Qt::Horizontal);

    auto layout = new QVBoxLayout;
    layout->addWidget(tabs, 1);
    layout->addWidget(mButtons);
    layout->setSizeConstraint(QLayout::SizeConstraint::SetFixedSize);
    setLayout(layout);

    setWindowTitle(tr("Configuration"));
    setModal(true);

    auto applyButton = mButtons->button(QDialogButtonBox::Apply);
    applyButton->setEnabled(false);

    lazyconnect(mGeneral, dirty, this, setDirty);
    lazyconnect(mAppearance, dirty, this, setDirty);
    lazyconnect(mKeyboard, dirty, this, setDirty);
    lazyconnect(mSound, dirty, this, setDirty);

    lazyconnect(applyButton, clicked, this, apply);
    lazyconnect(mButtons, accepted, this, accept);
    lazyconnect(mButtons, rejected, this, reject);

}